

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O2

void __thiscall
soul::ArrayWithPreallocation<FoundDelimiter,_4UL>::reserve
          (ArrayWithPreallocation<FoundDelimiter,_4UL> *this,size_t minSize)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  FoundDelimiter *pFVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  FoundDelimiter *pFVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  
  if (this->numAllocated < minSize) {
    uVar10 = minSize + 0xf & 0xfffffffffffffff0;
    if (uVar10 != 0) {
      pFVar8 = (FoundDelimiter *)operator_new__(uVar10 << 5);
      pFVar3 = this->items;
      uVar4 = this->numActive;
      lVar9 = 0;
      for (uVar11 = 0; uVar11 < uVar4; uVar11 = uVar11 + 1) {
        puVar1 = (undefined8 *)((long)&(pFVar3->range).outerStart + lVar9);
        uVar5 = *puVar1;
        uVar6 = puVar1[1];
        puVar1 = (undefined8 *)((long)&(pFVar3->range).delimiterLength + lVar9);
        uVar7 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pFVar8->range).delimiterLength + lVar9);
        *puVar2 = *puVar1;
        puVar2[1] = uVar7;
        puVar1 = (undefined8 *)((long)&(pFVar8->range).outerStart + lVar9);
        *puVar1 = uVar5;
        puVar1[1] = uVar6;
        lVar9 = lVar9 + 0x20;
      }
      freeIfHeapAllocated(this);
      this->items = pFVar8;
    }
    this->numAllocated = uVar10;
  }
  return;
}

Assistant:

void reserve (size_t minSize)
    {
        if (minSize > numAllocated)
        {
            minSize = getAlignedSize<16> (minSize);

            if (minSize > preallocatedItems)
            {
                auto* newObjects = reinterpret_cast<Item*> (new char[minSize * sizeof (Item)]);

                for (size_t i = 0; i < numActive; ++i)
                {
                    new (newObjects + i) Item (std::move (items[i]));
                    items[i].~Item();
                }

                freeIfHeapAllocated();
                items = newObjects;
            }

            numAllocated = minSize;
        }
    }